

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.h
# Opt level: O1

void __thiscall source::source(source *this,int _connfd)

{
  long lVar1;
  initializer_list<map_item> __l;
  allocator_type local_181;
  CharContent local_180;
  CharContent local_158;
  CharContent local_130;
  CharContent local_108;
  map_item local_e0 [2];
  
  this->_vptr_source = (_func_int **)&PTR__source_00117cd8;
  this->_conndfd = _connfd;
  CharContent::CharContent(&local_108,"/static");
  CharContent::CharContent(&local_130,"~/ServerContent");
  map_item::map_item(local_e0,&local_108,&local_130,1);
  CharContent::CharContent(&local_158,"/");
  CharContent::CharContent(&local_180,"~/ServerContent/cgi");
  map_item::map_item(local_e0 + 1,&local_158,&local_180,0);
  __l._M_len = 2;
  __l._M_array = local_e0;
  std::vector<map_item,_std::allocator<map_item>_>::vector(&this->url_maps,__l,&local_181);
  lVar1 = 0x60;
  do {
    map_item::~map_item((map_item *)((long)&local_e0[0]._vptr_map_item + lVar1));
    lVar1 = lVar1 + -0x60;
  } while (lVar1 != -0x60);
  local_180._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  if (local_180.m != (char *)0x0) {
    operator_delete__(local_180.m);
  }
  local_158._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  if (local_158.m != (char *)0x0) {
    operator_delete__(local_158.m);
  }
  local_130._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  if (local_130.m != (char *)0x0) {
    operator_delete__(local_130.m);
  }
  local_108._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  if (local_108.m != (char *)0x0) {
    operator_delete__(local_108.m);
  }
  return;
}

Assistant:

source(int _connfd):_conndfd(_connfd),
                        url_maps({
                                         map_item("/static","~/ServerContent",1),
                                         map_item("/","~/ServerContent/cgi",0)
                                 }){}